

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantmatrix.cc
# Opt level: O3

void __thiscall
fasttext::QuantMatrix::QuantMatrix(QuantMatrix *this,DenseMatrix *mat,int32_t dsub,bool qnorm)

{
  unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_> *this_00;
  unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_> *this_01;
  _Head_base<0UL,_fasttext::ProductQuantizer_*,_false> _Var1;
  int iVar2;
  int64_t iVar3;
  int64_t iVar4;
  _Head_base<0UL,_fasttext::ProductQuantizer_*,_false> _Var5;
  pointer *__ptr_1;
  pointer *__ptr;
  
  iVar3 = Matrix::size(&mat->super_Matrix,0);
  iVar4 = Matrix::size(&mat->super_Matrix,1);
  Matrix::Matrix(&this->super_Matrix,iVar3,iVar4);
  this_00 = &this->pq_;
  this_01 = &this->npq_;
  (this->super_Matrix)._vptr_Matrix = (_func_int **)&PTR__QuantMatrix_0014bbf8;
  (this->pq_)._M_t.
  super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
  ._M_t.
  super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
  .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl = (ProductQuantizer *)0x0
  ;
  (this->npq_)._M_t.
  super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
  ._M_t.
  super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
  .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl = (ProductQuantizer *)0x0
  ;
  (this->codes_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->codes_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->codes_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->norm_codes_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->norm_codes_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->norm_codes_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->qnorm_ = qnorm;
  iVar3 = Matrix::size(&mat->super_Matrix,0);
  iVar4 = Matrix::size(&mat->super_Matrix,1);
  iVar2 = (int)(((long)dsub + -1 + iVar4) / (long)dsub) * (int)iVar3;
  this->codesize_ = iVar2;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->codes_,(long)iVar2);
  _Var5._M_head_impl = (ProductQuantizer *)operator_new(0x50);
  ProductQuantizer::ProductQuantizer(_Var5._M_head_impl,(int32_t)(this->super_Matrix).n_,dsub);
  _Var1._M_head_impl =
       (this_00->_M_t).
       super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
       ._M_t.
       super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
       .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl;
  (this_00->_M_t).
  super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
  ._M_t.
  super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
  .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl = _Var5._M_head_impl;
  if (_Var1._M_head_impl != (ProductQuantizer *)0x0) {
    std::default_delete<fasttext::ProductQuantizer>::operator()
              ((default_delete<fasttext::ProductQuantizer> *)this_00,_Var1._M_head_impl);
  }
  if (this->qnorm_ == true) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->norm_codes_,(this->super_Matrix).m_);
    _Var5._M_head_impl = (ProductQuantizer *)operator_new(0x50);
    ProductQuantizer::ProductQuantizer(_Var5._M_head_impl,1,1);
    _Var1._M_head_impl =
         (this_01->_M_t).
         super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
         ._M_t.
         super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
         .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl;
    (this_01->_M_t).
    super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
    ._M_t.
    super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
    .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl = _Var5._M_head_impl;
    if (_Var1._M_head_impl != (ProductQuantizer *)0x0) {
      std::default_delete<fasttext::ProductQuantizer>::operator()
                ((default_delete<fasttext::ProductQuantizer> *)this_01,_Var1._M_head_impl);
    }
  }
  quantize(this,mat);
  return;
}

Assistant:

QuantMatrix::QuantMatrix(DenseMatrix&& mat, int32_t dsub, bool qnorm)
    : Matrix(mat.size(0), mat.size(1)),
      qnorm_(qnorm),
      codesize_(mat.size(0) * ((mat.size(1) + dsub - 1) / dsub)) {
  codes_.resize(codesize_);
  pq_ = std::unique_ptr<ProductQuantizer>(new ProductQuantizer(n_, dsub));
  if (qnorm_) {
    norm_codes_.resize(m_);
    npq_ = std::unique_ptr<ProductQuantizer>(new ProductQuantizer(1, 1));
  }
  quantize(std::forward<DenseMatrix>(mat));
}